

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

Vector3D * __thiscall
CMU462::Vertex::neighborhoodCentroid(Vector3D *__return_storage_ptr__,Vertex *this)

{
  _List_node_base *p_Var1;
  double dVar2;
  double local_20;
  
  __return_storage_ptr__->z = 0.0;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  p_Var1 = (this->_halfedge)._M_node;
  dVar2 = 0.0;
  do {
    Vector3D::operator+=
              (__return_storage_ptr__,(Vector3D *)&p_Var1[2]._M_next[2]._M_prev[1]._M_prev);
    dVar2 = dVar2 + 1.0;
    p_Var1 = p_Var1[1]._M_prev[2]._M_next;
  } while (p_Var1 != (this->_halfedge)._M_node);
  local_20 = dVar2;
  Vector3D::operator/=(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Vertex::neighborhoodCentroid() const
  {
    Vector3D c( 0., 0., 0. ); // centroid
    double d = 0.; // degree (i.e., number of neighbors)

    // Iterate over neighbors.
    HalfedgeCIter h = halfedge();
    do {
      // Add the contribution of the neighbor,
      // and increment the number of neighbors.
      c += h->next()->vertex()->position;
      d += 1.;

      h = h->twin()->next();
    } while( h != halfedge() );

    c /= d; // compute the average

    return c;
  }